

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetEntityIDList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
          *EI)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  *EI_local;
  Aggregate_State_PDU *this_local;
  
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + this->m_ui16NumEntities * -6;
  std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ::operator=(&this->m_vEI,EI);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
          ::size(&this->m_vEI);
  this->m_ui16NumEntities = (KUINT16)sVar1;
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + this->m_ui16NumEntities * 6;
  updatePadding(this);
  return;
}

Assistant:

void Aggregate_State_PDU::SetEntityIDList( const vector<EntityIdentifier> & EI )
{
    // Reset the PDU length field
    m_ui16PDULength -= m_ui16NumEntities * EntityIdentifier::ENTITY_IDENTIFER_SIZE;

    m_vEI = EI;
    m_ui16NumEntities = m_vEI.size();
    m_ui16PDULength += m_ui16NumEntities * EntityIdentifier::ENTITY_IDENTIFER_SIZE;
    updatePadding();
}